

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O3

int evutil_socket_connect_(int *fd_ptr,sockaddr *sa,int socklen)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  
  iVar1 = *fd_ptr;
  iVar2 = iVar1;
  if (iVar1 < 0) {
    iVar2 = socket((uint)sa->sa_family,1,0);
    *fd_ptr = iVar2;
    if (iVar2 < 0) {
      return -1;
    }
    iVar2 = evutil_make_socket_nonblocking(iVar2);
    if (iVar2 < 0) goto LAB_00230db2;
    iVar2 = *fd_ptr;
  }
  iVar2 = connect(iVar2,(sockaddr *)sa,socklen);
  if (-1 < iVar2) {
    return 1;
  }
  piVar3 = __errno_location();
  iVar2 = *piVar3;
  if (iVar2 == 4) {
    return 0;
  }
  if (iVar2 == 0x73) {
    return 0;
  }
  if (iVar2 == 0x6f) {
    return 2;
  }
  if (-1 < iVar1) {
    return -1;
  }
LAB_00230db2:
  close(*fd_ptr);
  *fd_ptr = -1;
  return -1;
}

Assistant:

int
evutil_socket_connect_(evutil_socket_t *fd_ptr, const struct sockaddr *sa, int socklen)
{
	int made_fd = 0;

	if (*fd_ptr < 0) {
		if ((*fd_ptr = socket(sa->sa_family, SOCK_STREAM, 0)) < 0)
			goto err;
		made_fd = 1;
		if (evutil_make_socket_nonblocking(*fd_ptr) < 0) {
			goto err;
		}
	}

	if (connect(*fd_ptr, sa, socklen) < 0) {
		int e = evutil_socket_geterror(*fd_ptr);
		if (EVUTIL_ERR_CONNECT_RETRIABLE(e))
			return 0;
		if (EVUTIL_ERR_CONNECT_REFUSED(e))
			return 2;
		goto err;
	} else {
		return 1;
	}

err:
	if (made_fd) {
		evutil_closesocket(*fd_ptr);
		*fd_ptr = -1;
	}
	return -1;
}